

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_skylight.cpp
# Opt level: O0

void __thiscall ON_Skylight::ON_Skylight(ON_Skylight *this,ON_Skylight *sl)

{
  CImpl *this_00;
  ON_Skylight *sl_local;
  ON_Skylight *this_local;
  
  this->_vptr_ON_Skylight = (_func_int **)&PTR__ON_Skylight_00b78880;
  this_00 = (CImpl *)operator_new(0x40);
  CImpl::CImpl(this_00);
  this->m_impl = this_00;
  (*this->_vptr_ON_Skylight[2])(this,sl);
  return;
}

Assistant:

ON_Skylight::ON_Skylight(const ON_Skylight& sl)
{
  m_impl = new CImpl;
  operator = (sl);
}